

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O0

ssize_t uv__fs_preadv(uv_file fd,uv_buf_t *bufs,uint nbufs,off_t off)

{
  ssize_t sVar1;
  int *piVar2;
  bool bVar3;
  ulong local_58;
  size_t pos;
  ssize_t rc;
  ssize_t result;
  uv_buf_t *end;
  uv_buf_t *buf;
  off_t off_local;
  uint nbufs_local;
  uv_buf_t *bufs_local;
  uv_file fd_local;
  
  if (nbufs == 0) {
    __assert_fail("nbufs > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibuv/src/unix/fs.c"
                  ,0x1af,"ssize_t uv__fs_preadv(uv_file, uv_buf_t *, unsigned int, off_t)");
  }
  rc = 0;
  local_58 = 0;
  end = bufs;
  while( true ) {
    do {
      sVar1 = pread(fd,end->base + local_58,end->len - local_58,off + rc);
      bVar3 = false;
      if (sVar1 == -1) {
        piVar2 = __errno_location();
        bVar3 = *piVar2 == 4;
      }
    } while (bVar3);
    if (sVar1 == 0) break;
    if ((sVar1 == -1) && (rc == 0)) {
      piVar2 = __errno_location();
      return (long)-*piVar2;
    }
    if (sVar1 == -1) {
      return rc;
    }
    local_58 = sVar1 + local_58;
    rc = sVar1 + rc;
    if (end->len <= local_58) {
      local_58 = 0;
      end = end + 1;
      if (end == bufs + nbufs) {
        return rc;
      }
    }
  }
  return rc;
}

Assistant:

static ssize_t uv__fs_preadv(uv_file fd,
                             uv_buf_t* bufs,
                             unsigned int nbufs,
                             off_t off) {
  uv_buf_t* buf;
  uv_buf_t* end;
  ssize_t result;
  ssize_t rc;
  size_t pos;

  assert(nbufs > 0);

  result = 0;
  pos = 0;
  buf = bufs + 0;
  end = bufs + nbufs;

  for (;;) {
    do
      rc = pread(fd, buf->base + pos, buf->len - pos, off + result);
    while (rc == -1 && errno == EINTR);

    if (rc == 0)
      break;

    if (rc == -1 && result == 0)
      return UV__ERR(errno);

    if (rc == -1)
      break;  /* We read some data so return that, ignore the error. */

    pos += rc;
    result += rc;

    if (pos < buf->len)
      continue;

    pos = 0;
    buf += 1;

    if (buf == end)
      break;
  }

  return result;
}